

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Adaptive_Data_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_38;
  uint z;
  uint m_1;
  uint m;
  uint t;
  uint dv;
  uint y;
  uint x;
  uint s;
  uint n;
  Adaptive_Data_Model *M_local;
  Arithmetic_Codec *this_local;
  
  t = this->length;
  if (M->decoder_table == (uint *)0x0) {
    y = 0;
    dv = 0;
    this->length = this->length >> 0xf;
    x = M->data_symbols;
    local_38 = x >> 1;
    do {
      uVar2 = this->length * M->distribution[local_38];
      if (this->value < uVar2) {
        x = local_38;
        t = uVar2;
      }
      else {
        y = local_38;
        dv = uVar2;
      }
      local_38 = y + x >> 1;
    } while (local_38 != y);
  }
  else {
    uVar3 = this->length >> 0xf;
    this->length = uVar3;
    uVar3 = this->value / uVar3;
    uVar1 = uVar3 >> ((byte)M->table_shift & 0x1f);
    uVar2 = M->decoder_table[uVar1];
    x = M->decoder_table[uVar1 + 1] + 1;
    while (y = uVar2, y + 1 < x) {
      uVar1 = y + x >> 1;
      uVar2 = uVar1;
      if (uVar3 < M->distribution[uVar1]) {
        uVar2 = y;
        x = uVar1;
      }
    }
    dv = M->distribution[y] * this->length;
    if (y != M->last_symbol) {
      t = M->distribution[y + 1] * this->length;
    }
  }
  this->value = this->value - dv;
  this->length = t - dv;
  if (this->length < 0x1000000) {
    renorm_dec_interval(this);
  }
  M->symbol_count[y] = M->symbol_count[y] + 1;
  uVar2 = M->symbols_until_update - 1;
  M->symbols_until_update = uVar2;
  if (uVar2 == 0) {
    Adaptive_Data_Model::update(M,false);
  }
  return y;
}

Assistant:

unsigned Arithmetic_Codec::decode(Adaptive_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned n, s, x, y = length;

      if (M.decoder_table) {              // use table look-up for faster decoding

        unsigned dv = value / (length >>= DM__LengthShift);
        unsigned t = dv >> M.table_shift;

        s = M.decoder_table[t];         // initial decision based on table look-up
        n = M.decoder_table[t+1] + 1;

        while (n > s + 1) {                        // finish with bisection search
          unsigned m = (s + n) >> 1;
          if (M.distribution[m] > dv) n = m; else s = m;
        }
                                                               // compute products
        x = M.distribution[s] * length;
        if (s != M.last_symbol) {
            y = M.distribution[s+1] * length;
        }
      }

      else {                                  // decode using only multiplications

        x = s = 0;
        length >>= DM__LengthShift;
        unsigned m = (n = M.data_symbols) >> 1;
                                                    // decode via bisection search
        do {
          unsigned z = length * M.distribution[m];
          if (z > value) {
            n = m;
            y = z;                                             // value is smaller
          }
          else {
            s = m;
            x = z;                                     // value is larger or equal
          }
        } while ((m = (s + n) >> 1) != s);
      }

      value -= x;                                               // update interval
      length = y - x;

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      ++M.symbol_count[s];
      if (--M.symbols_until_update == 0) M.update(false);  // periodic model update

      return s;
    }